

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.h
# Opt level: O1

bool google::protobuf::MathUtil::WithinFractionOrMargin<float>
               (float x,float y,float fraction,float margin)

{
  bool bVar1;
  LogMessage *other;
  float fVar2;
  float fVar3;
  float fVar4;
  LogMessage local_a0;
  float local_68;
  float local_58;
  float local_48;
  float local_38;
  LogFinisher local_19;
  
  if ((fraction < 0.0 || margin < 0.0) || 1.0 <= fraction) {
    local_68 = y;
    local_58 = margin;
    local_48 = x;
    local_38 = fraction;
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/mathutil.h"
               ,0x8e);
    other = internal::LogMessage::operator<<
                      (&local_a0,
                       "CHECK failed: (T(0) < fraction || T(0) == fraction) && fraction < T(1) && margin >= T(0): "
                      );
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_a0);
    fraction = local_38;
    margin = local_58;
    x = local_48;
    y = local_68;
  }
  if ((uint)ABS(x) < 0x7f800000 && (uint)ABS(y) < 0x7f800000) {
    fVar3 = x;
    if (x <= -x) {
      fVar3 = -x;
    }
    fVar2 = y;
    if (y <= -y) {
      fVar2 = -y;
    }
    fVar4 = fVar3;
    if (fVar3 <= fVar2) {
      fVar4 = fVar2;
    }
    fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar4 | -(uint)NAN(fVar3) & (uint)fVar3) * fraction;
    fVar3 = margin;
    if (margin <= fVar2) {
      fVar3 = fVar2;
    }
    bVar1 = (float)(~-(uint)(y < x) & (uint)(y - x) | (uint)(x - y) & -(uint)(y < x)) <=
            (float)(-(uint)NAN(margin) & (uint)margin | ~-(uint)NAN(margin) & (uint)fVar3);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MathUtil::WithinFractionOrMargin(const T x, const T y,
                                      const T fraction, const T margin) {
  // Not just "0 <= fraction" to fool the compiler for unsigned types.
  GOOGLE_DCHECK((T(0) < fraction || T(0) == fraction) &&
         fraction < T(1) &&
         margin >= T(0));

  // Template specialization will convert the if() condition to a constant,
  // which will cause the compiler to generate code for either the "if" part
  // or the "then" part.  In this way we avoid a compiler warning
  // about a potential integer overflow in crosstool v12 (gcc 4.3.1).
  if (std::numeric_limits<T>::is_integer) {
    return x == y;
  } else {
    if (!std::isfinite(x) || !std::isfinite(y)) {
      return false;
    }
    T relative_margin = static_cast<T>(fraction * Max(Abs(x), Abs(y)));
    return AbsDiff(x, y) <= Max(margin, relative_margin);
  }
}